

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynBase * ParseTerminal(ParseContext *ctx)

{
  LexemeType type;
  Lexeme *begin;
  int iVar1;
  SynUnaryOpType type_00;
  uint uVar2;
  undefined4 extraout_var;
  Lexeme *pLVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  SynBase *pSVar4;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  SynPreModify *this_00;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  SynNumber *pSVar5;
  SynNew *pSVar6;
  SynFunctionDefinition *pSVar7;
  SynShortFunctionDefinition *pSVar8;
  bool bVar9;
  char *msg;
  InplaceStr IVar10;
  SynCharacter *this;
  undefined4 extraout_var_08;
  
  begin = ctx->currentLexeme;
  type = begin->type;
  if (type == lex_semiquotedchar) {
    IVar10 = ParseContext::Consume(ctx);
    uVar2 = (int)IVar10.end - (int)IVar10.begin;
    if ((uVar2 == 1) || (IVar10.begin[uVar2 - 1] != '\'')) {
      msg = "ERROR: unclosed character constant";
LAB_00112c6c:
      anon_unknown.dwarf_1519a::Stop(ctx,begin,msg);
    }
    if (uVar2 < 4) {
      if (uVar2 != 3) {
        msg = "ERROR: empty character constant";
        goto LAB_00112c6c;
      }
    }
    else if ((uVar2 != 4) || (IVar10.begin[1] != '\\')) {
      msg = "ERROR: only one character can be inside single quotes";
      goto LAB_00112c6c;
    }
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    this = (SynCharacter *)CONCAT44(extraout_var_06,iVar1);
    pLVar3 = ParseContext::Previous(ctx);
    SynCharacter::SynCharacter(this,begin,pLVar3,IVar10);
  }
  else if (type == lex_bitand) {
    ctx->currentLexeme = begin + 1;
    pSVar4 = ParseComplexTerminal(ctx);
    if (pSVar4 == (SynBase *)0x0) {
      anon_unknown.dwarf_1519a::Report
                (ctx,ctx->currentLexeme,"ERROR: variable not found after \'&\'");
      iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pSVar4 = (SynBase *)CONCAT44(extraout_var_00,iVar1);
      pLVar3 = ParseContext::Previous(ctx);
      SynError::SynError((SynError *)pSVar4,begin,pLVar3);
    }
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    this = (SynCharacter *)CONCAT44(extraout_var_01,iVar1);
    pLVar3 = ParseContext::Previous(ctx);
    SynGetAddress::SynGetAddress((SynGetAddress *)this,begin,pLVar3,pSVar4);
  }
  else if (type == lex_nullptr) {
    ctx->currentLexeme = begin + 1;
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    this = (SynCharacter *)CONCAT44(extraout_var_03,iVar1);
    pLVar3 = ParseContext::Previous(ctx);
    SynNullptr::SynNullptr((SynNullptr *)this,begin,pLVar3);
  }
  else {
    if (type == lex_false) {
      ctx->currentLexeme = begin + 1;
      iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      this = (SynCharacter *)CONCAT44(extraout_var_02,iVar1);
      pLVar3 = ParseContext::Previous(ctx);
      bVar9 = false;
    }
    else {
      if (type != lex_true) {
        type_00 = GetUnaryOpType(type);
        if (type_00 != SYN_UNARY_OP_UNKNOWN) {
          IVar10 = ParseContext::Consume(ctx);
          pSVar4 = ParseTerminal(ctx);
          if (pSVar4 == (SynBase *)0x0) {
            anon_unknown.dwarf_1519a::Report
                      (ctx,ctx->currentLexeme,"ERROR: expression not found after \'%.*s\'",
                       (ulong)(uint)((int)IVar10.end - (int)IVar10.begin),IVar10.begin);
            iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
            pSVar4 = (SynBase *)CONCAT44(extraout_var_04,iVar1);
            pLVar3 = ParseContext::Previous(ctx);
            SynError::SynError((SynError *)pSVar4,begin,pLVar3);
          }
          iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
          pLVar3 = ParseContext::Previous(ctx);
          SynUnaryOp::SynUnaryOp
                    ((SynUnaryOp *)CONCAT44(extraout_var_05,iVar1),begin,pLVar3,type_00,pSVar4);
          return &((SynUnaryOp *)CONCAT44(extraout_var_05,iVar1))->super_SynBase;
        }
        if (type == lex_inc) {
          ctx->currentLexeme = begin + 1;
          pSVar4 = ParseTerminal(ctx);
          if (pSVar4 == (SynBase *)0x0) {
            anon_unknown.dwarf_1519a::Report
                      (ctx,ctx->currentLexeme,"ERROR: variable not found after \'++\'");
            iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
            pSVar4 = (SynBase *)CONCAT44(extraout_var_09,iVar1);
            pLVar3 = ParseContext::Previous(ctx);
            SynError::SynError((SynError *)pSVar4,begin,pLVar3);
          }
          iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
          this_00 = (SynPreModify *)CONCAT44(extraout_var_10,iVar1);
          pLVar3 = ParseContext::Previous(ctx);
          bVar9 = true;
        }
        else {
          if (type != lex_dec) {
            pSVar5 = ParseNumber(ctx);
            if (pSVar5 != (SynNumber *)0x0) {
              return &pSVar5->super_SynBase;
            }
            pSVar6 = ParseNew(ctx);
            if (pSVar6 != (SynNew *)0x0) {
              return &pSVar6->super_SynBase;
            }
            pSVar4 = ParseSizeof(ctx);
            if (pSVar4 != (SynBase *)0x0) {
              return pSVar4;
            }
            pSVar7 = ParseFunctionDefinition(ctx);
            if (pSVar7 != (SynFunctionDefinition *)0x0) {
              return &pSVar7->super_SynBase;
            }
            pSVar8 = ParseShortFunctionDefinition(ctx);
            if (pSVar8 != (SynShortFunctionDefinition *)0x0) {
              return &pSVar8->super_SynBase;
            }
            pSVar4 = ParseComplexTerminal(ctx);
            return pSVar4;
          }
          ctx->currentLexeme = begin + 1;
          pSVar4 = ParseTerminal(ctx);
          if (pSVar4 == (SynBase *)0x0) {
            anon_unknown.dwarf_1519a::Report
                      (ctx,ctx->currentLexeme,"ERROR: variable not found after \'--\'");
            iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
            pSVar4 = (SynBase *)CONCAT44(extraout_var_07,iVar1);
            pLVar3 = ParseContext::Previous(ctx);
            SynError::SynError((SynError *)pSVar4,begin,pLVar3);
          }
          iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
          this_00 = (SynPreModify *)CONCAT44(extraout_var_08,iVar1);
          pLVar3 = ParseContext::Previous(ctx);
          bVar9 = false;
        }
        SynPreModify::SynPreModify(this_00,begin,pLVar3,pSVar4,bVar9);
        return &this_00->super_SynBase;
      }
      ctx->currentLexeme = begin + 1;
      iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      this = (SynCharacter *)CONCAT44(extraout_var,iVar1);
      pLVar3 = ParseContext::Previous(ctx);
      bVar9 = true;
    }
    SynBool::SynBool((SynBool *)this,begin,pLVar3,bVar9);
  }
  return &this->super_SynBase;
}

Assistant:

SynBase* ParseTerminal(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_true))
		return new (ctx.get<SynBool>()) SynBool(start, ctx.Previous(), true);

	if(ctx.Consume(lex_false))
		return new (ctx.get<SynBool>()) SynBool(start, ctx.Previous(), false);

	if(ctx.Consume(lex_nullptr))
		return new (ctx.get<SynNullptr>()) SynNullptr(start, ctx.Previous());

	if(ctx.Consume(lex_bitand))
	{
		SynBase *node = ParseComplexTerminal(ctx);

		if(!node)
		{
			Report(ctx, ctx.Current(), "ERROR: variable not found after '&'");

			node = new (ctx.get<SynError>()) SynError(start, ctx.Previous());
		}

		return new (ctx.get<SynGetAddress>()) SynGetAddress(start, ctx.Previous(), node);
	}

	if(ctx.At(lex_semiquotedchar))
	{
		InplaceStr str = ctx.Consume();

		if(str.length() == 1 || str.begin[str.length() - 1] != '\'')
			Stop(ctx, start, "ERROR: unclosed character constant");
		else if((str.length() > 3 && str.begin[1] != '\\') || str.length() > 4)
			Stop(ctx, start, "ERROR: only one character can be inside single quotes");
		else if(str.length() < 3)
			Stop(ctx, start, "ERROR: empty character constant");

		return new (ctx.get<SynCharacter>()) SynCharacter(start, ctx.Previous(), str);
	}

	if(SynUnaryOpType type = GetUnaryOpType(ctx.Peek()))
	{
		InplaceStr name = ctx.Consume();

		SynBase *value = ParseTerminal(ctx);

		if(!value)
		{
			Report(ctx, ctx.Current(), "ERROR: expression not found after '%.*s'", name.length(), name.begin);

			value = new (ctx.get<SynError>()) SynError(start, ctx.Previous());
		}

		return new (ctx.get<SynUnaryOp>()) SynUnaryOp(start, ctx.Previous(), type, value);
	}

	if(ctx.Consume(lex_dec))
	{
		SynBase *value = ParseTerminal(ctx);

		if(!value)
		{
			Report(ctx, ctx.Current(), "ERROR: variable not found after '--'");

			value = new (ctx.get<SynError>()) SynError(start, ctx.Previous());
		}

		return new (ctx.get<SynPreModify>()) SynPreModify(start, ctx.Previous(), value, false);
	}

	if(ctx.Consume(lex_inc))
	{
		SynBase *value = ParseTerminal(ctx);

		if(!value)
		{
			Report(ctx, ctx.Current(), "ERROR: variable not found after '++'");

			value = new (ctx.get<SynError>()) SynError(start, ctx.Previous());
		}

		return new (ctx.get<SynPreModify>()) SynPreModify(start, ctx.Previous(), value, true);
	}

	if(SynNumber *node = ParseNumber(ctx))
		return node;

	if(SynNew *node = ParseNew(ctx))
		return node;

	if(SynBase *node = ParseSizeof(ctx))
		return node;

	if(SynBase *node = ParseFunctionDefinition(ctx))
		return node;

	if(SynBase *node = ParseShortFunctionDefinition(ctx))
		return node;

	if(SynBase *node = ParseComplexTerminal(ctx))
		return node;

	return NULL;
}